

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

dxil_spv_result dxil_spv_parse_dxil_blob(void *data,size_t size,dxil_spv_parsed_blob *blob)

{
  pointer data_00;
  bool bVar1;
  dxil_spv_parsed_blob_s *this;
  Vector<uint8_t> *pVVar2;
  Vector<RDATSubobject> *pVVar3;
  LLVMBCParser *parser_00;
  dxil_spv_result dVar4;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *name;
  Vector<String> names;
  DXILContainerParser parser;
  EntryPoint local_130;
  
  this = (dxil_spv_parsed_blob_s *)operator_new(0x70,(nothrow_t *)&std::nothrow);
  if (this == (dxil_spv_parsed_blob_s *)0x0) {
    return DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  dxil_spv_parsed_blob_s::dxil_spv_parsed_blob_s(this);
  parser.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.dxil_blob.super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.dxil_blob.super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.dxil_blob.super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = dxil_spv::DXILContainerParser::parse_container(&parser,data,size,false);
  if (bVar1) {
    pVVar2 = dxil_spv::DXILContainerParser::get_blob(&parser);
    std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::_M_move_assign
              (&this->dxil_blob,pVVar2);
    pVVar3 = dxil_spv::DXILContainerParser::get_rdat_subobjects(&parser);
    std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
    _M_move_assign(&this->rdat_subobjects,pVVar3);
    data_00 = (this->dxil_blob).
              super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar1 = dxil_spv::LLVMBCParser::parse
                      ((LLVMBCParser *)this,data_00,
                       (long)(this->dxil_blob).
                             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)data_00);
    if (bVar1) {
      dxil_spv::Converter::get_entry_points_abi_cxx11_(&names,(Converter *)this,parser_00);
      for (; names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string(&local_130.mangled,
                     names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        dxil_spv::demangle_entry_point
                  (&local_130.demangled,
                   names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        dxil_spv::Converter::get_node_input
                  (&local_130.node_input,(LLVMBCParser *)this,
                   ((names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        dxil_spv::Converter::get_node_outputs
                  (&local_130.node_outputs,(LLVMBCParser *)this,
                   ((names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        std::
        vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
        ::emplace_back<dxil_spv_parsed_blob_s::EntryPoint>(&this->entry_points,&local_130);
        dxil_spv_parsed_blob_s::EntryPoint::~EntryPoint(&local_130);
      }
      *blob = this;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
      ::~vector(&names);
      dVar4 = DXIL_SPV_SUCCESS;
      goto LAB_00106b81;
    }
  }
  dxil_spv_parsed_blob_s::~dxil_spv_parsed_blob_s(this);
  operator_delete(this,0x70);
  dVar4 = DXIL_SPV_ERROR_PARSER;
LAB_00106b81:
  dxil_spv::DXILContainerParser::~DXILContainerParser(&parser);
  return dVar4;
}

Assistant:

dxil_spv_result dxil_spv_parse_dxil_blob(const void *data, size_t size, dxil_spv_parsed_blob *blob)
{
	auto *parsed = new (std::nothrow) dxil_spv_parsed_blob_s;
	if (!parsed)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	DXILContainerParser parser;
	if (!parser.parse_container(data, size, false))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	parsed->dxil_blob = std::move(parser.get_blob());
	parsed->rdat_subobjects = std::move(parser.get_rdat_subobjects());

	if (!parsed->bc.parse(parsed->dxil_blob.data(), parsed->dxil_blob.size()))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	auto names = Converter::get_entry_points(parsed->bc);
	for (auto &name : names)
	{
		parsed->entry_points.push_back({
			name, demangle_entry_point(name),
			Converter::get_node_input(parsed->bc, name.c_str()),
			Converter::get_node_outputs(parsed->bc, name.c_str())
		});
	}

	*blob = parsed;
	return DXIL_SPV_SUCCESS;
}